

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

void google::protobuf::internal::WireFormat::SerializeMessageSetItemWithCachedSizes
               (FieldDescriptor *field,Message *message,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  long *plVar6;
  ulong uVar7;
  byte *pbVar8;
  uint uVar9;
  ulong uVar10;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,0xb);
    iVar4 = output->buffer_size_;
  }
  else {
    *output->buffer_ = '\v';
    output->buffer_ = output->buffer_ + 1;
    iVar4 = output->buffer_size_ + -1;
    output->buffer_size_ = iVar4;
  }
  if (iVar4 < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,0x10);
    iVar4 = output->buffer_size_;
  }
  else {
    *output->buffer_ = '\x10';
    output->buffer_ = output->buffer_ + 1;
    iVar4 = output->buffer_size_ + -1;
    output->buffer_size_ = iVar4;
  }
  uVar5 = *(uint *)(field + 0x38);
  if (iVar4 < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar5);
    iVar4 = output->buffer_size_;
  }
  else {
    pbVar1 = output->buffer_;
    pbVar8 = pbVar1;
    uVar9 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar8 = (byte)uVar5 | 0x80;
        uVar9 = uVar5 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar9;
      } while (bVar2);
    }
    *pbVar8 = (byte)uVar9;
    iVar4 = ((int)pbVar8 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar4;
    iVar4 = output->buffer_size_ - iVar4;
    output->buffer_size_ = iVar4;
  }
  if (iVar4 < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,0x1a);
  }
  else {
    *output->buffer_ = '\x1a';
    output->buffer_ = output->buffer_ + 1;
    output->buffer_size_ = output->buffer_size_ + -1;
  }
  plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xd8))
                             ((long *)CONCAT44(extraout_var,iVar3),message,field,0);
  uVar7 = (**(code **)(*plVar6 + 0x78))(plVar6);
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,(uint)uVar7);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar8 = pbVar1;
    if ((uint)uVar7 < 0x80) {
      uVar7 = uVar7 & 0xffffffff;
    }
    else {
      uVar10 = uVar7 & 0xffffffff;
      do {
        uVar5 = (uint)uVar7;
        *pbVar8 = (byte)uVar7 | 0x80;
        uVar7 = uVar10 >> 7;
        pbVar8 = pbVar8 + 1;
        uVar10 = uVar7;
      } while (0x3fff < uVar5);
    }
    *pbVar8 = (byte)uVar7;
    iVar3 = ((int)pbVar8 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar3;
    output->buffer_size_ = output->buffer_size_ - iVar3;
  }
  (**(code **)(*plVar6 + 0x68))(plVar6,output);
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,0xc);
    return;
  }
  *output->buffer_ = '\f';
  output->buffer_ = output->buffer_ + 1;
  output->buffer_size_ = output->buffer_size_ + -1;
  return;
}

Assistant:

void WireFormat::SerializeMessageSetItemWithCachedSizes(
    const FieldDescriptor* field,
    const Message& message,
    io::CodedOutputStream* output) {
  const Reflection* message_reflection = message.GetReflection();

  // Start group.
  output->WriteVarint32(WireFormatLite::kMessageSetItemStartTag);

  // Write type ID.
  output->WriteVarint32(WireFormatLite::kMessageSetTypeIdTag);
  output->WriteVarint32(field->number());

  // Write message.
  output->WriteVarint32(WireFormatLite::kMessageSetMessageTag);

  const Message& sub_message = message_reflection->GetMessage(message, field);
  output->WriteVarint32(sub_message.GetCachedSize());
  sub_message.SerializeWithCachedSizes(output);

  // End group.
  output->WriteVarint32(WireFormatLite::kMessageSetItemEndTag);
}